

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_x509.cc
# Opt level: O0

UniquePtr<CRYPTO_BUFFER> __thiscall bssl::x509_to_buffer(bssl *this,X509 *x509)

{
  int iVar1;
  CRYPTO_BUFFER *__p;
  uint8_t *puStack_20;
  int cert_len;
  uint8_t *buf;
  X509 *x509_local;
  UniquePtr<CRYPTO_BUFFER> *buffer;
  
  puStack_20 = (uint8_t *)0x0;
  buf = (uint8_t *)x509;
  x509_local = (X509 *)this;
  iVar1 = i2d_X509(x509,&stack0xffffffffffffffe0);
  if (iVar1 < 1) {
    std::unique_ptr<crypto_buffer_st,bssl::internal::Deleter>::
    unique_ptr<bssl::internal::Deleter,void>
              ((unique_ptr<crypto_buffer_st,bssl::internal::Deleter> *)this,(nullptr_t)0x0);
  }
  else {
    __p = CRYPTO_BUFFER_new(puStack_20,(long)iVar1,(CRYPTO_BUFFER_POOL *)0x0);
    std::unique_ptr<crypto_buffer_st,bssl::internal::Deleter>::
    unique_ptr<bssl::internal::Deleter,void>
              ((unique_ptr<crypto_buffer_st,bssl::internal::Deleter> *)this,__p);
    OPENSSL_free(puStack_20);
  }
  return (__uniq_ptr_data<crypto_buffer_st,_bssl::internal::Deleter,_true,_true>)
         (__uniq_ptr_data<crypto_buffer_st,_bssl::internal::Deleter,_true,_true>)this;
}

Assistant:

static UniquePtr<CRYPTO_BUFFER> x509_to_buffer(X509 *x509) {
  uint8_t *buf = NULL;
  int cert_len = i2d_X509(x509, &buf);
  if (cert_len <= 0) {
    return 0;
  }

  UniquePtr<CRYPTO_BUFFER> buffer(CRYPTO_BUFFER_new(buf, cert_len, NULL));
  OPENSSL_free(buf);

  return buffer;
}